

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__png_info_raw(stbi__png *p,int *x,int *y,int *comp)

{
  stbi__context *psVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  iVar2 = stbi__parse_png_file(p,2,0);
  if (iVar2 == 0) {
    psVar1 = p->s;
    psVar1->img_buffer = psVar1->img_buffer_original;
    psVar1->img_buffer_end = psVar1->img_buffer_original_end;
  }
  else {
    if (x != (int *)0x0) {
      *x = p->s->img_x;
    }
    if (y != (int *)0x0) {
      *y = p->s->img_y;
    }
    iVar3 = 1;
    if (comp != (int *)0x0) {
      *comp = p->s->img_n;
    }
  }
  return iVar3;
}

Assistant:

static int stbi__png_info_raw(stbi__png *p, int *x, int *y, int *comp)
{
   if (!stbi__parse_png_file(p, STBI__SCAN_header, 0)) {
      stbi__rewind( p->s );
      return 0;
   }
   if (x) *x = p->s->img_x;
   if (y) *y = p->s->img_y;
   if (comp) *comp = p->s->img_n;
   return 1;
}